

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_affinity.h
# Opt level: O3

void __thiscall hierarchy_info::resize(hierarchy_info *this,kmp_uint32 nproc)

{
  uint uVar1;
  kmp_uint32 *pkVar2;
  kmp_uint32 *pkVar3;
  kmp_uint32 *ptr;
  uint uVar4;
  kmp_uint32 *pkVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  bool bVar11;
  
  LOCK();
  bVar11 = this->resizing == '\0';
  if (bVar11) {
    this->resizing = '\x01';
  }
  UNLOCK();
  while (!bVar11) {
    if (nproc <= this->base_num_threads) {
      return;
    }
    LOCK();
    bVar11 = this->resizing == '\0';
    if (bVar11) {
      this->resizing = '\x01';
    }
    UNLOCK();
  }
  if (this->base_num_threads < nproc) {
    pkVar2 = this->skipPerLevel;
    uVar1 = this->maxLevels;
    uVar10 = (ulong)uVar1;
    uVar6 = this->depth;
    uVar9 = (ulong)uVar6;
    uVar4 = pkVar2[uVar6 - 1];
    bVar11 = uVar4 < nproc;
    uVar7 = uVar1;
    if (uVar6 < uVar1 && bVar11) {
      pkVar3 = this->numPerLevel;
      do {
        uVar6 = (int)uVar9 - 1;
        pkVar2[uVar9] = pkVar2[uVar6] * 2;
        pkVar3[uVar6] = pkVar3[uVar6] << 1;
        uVar4 = uVar4 * 2;
        uVar7 = this->maxLevels;
        uVar6 = this->depth + 1;
        this->depth = uVar6;
        uVar9 = uVar9 + 1;
        bVar11 = uVar4 < nproc;
        if (uVar7 <= uVar9) break;
      } while (uVar4 < nproc);
    }
    if (bVar11) {
      iVar8 = 0;
      if (uVar4 < nproc) {
        iVar8 = 0;
        do {
          uVar4 = uVar4 * 2;
          iVar8 = iVar8 + 1;
        } while (uVar4 < nproc);
        this->depth = uVar6 + iVar8;
      }
      this->maxLevels = iVar8 + uVar7;
      ptr = this->numPerLevel;
      this->numPerLevel = (kmp_uint32 *)0x0;
      this->skipPerLevel = (kmp_uint32 *)0x0;
      pkVar5 = (kmp_uint32 *)___kmp_allocate((ulong)((iVar8 + uVar7) * 2) << 2);
      this->numPerLevel = pkVar5;
      uVar6 = this->maxLevels;
      pkVar3 = pkVar5 + uVar6;
      this->skipPerLevel = pkVar3;
      if (uVar1 != 0) {
        uVar9 = 0;
        do {
          pkVar5[uVar9] = ptr[uVar9];
          pkVar3[uVar9] = pkVar2[uVar9];
          uVar9 = uVar9 + 1;
        } while (uVar10 != uVar9);
        uVar6 = this->maxLevels;
      }
      uVar9 = uVar10;
      if (uVar1 < uVar6) {
        do {
          pkVar5[uVar9] = 1;
          pkVar3[uVar9] = 1;
          uVar9 = uVar9 + 1;
        } while (uVar9 < this->maxLevels);
      }
      ___kmp_free(ptr);
      uVar7 = this->maxLevels;
    }
    if (uVar1 < uVar7) {
      pkVar2 = this->skipPerLevel;
      do {
        pkVar2[uVar10] = pkVar2[(int)uVar10 - 1] * 2;
        uVar10 = uVar10 + 1;
      } while (uVar10 < this->maxLevels);
    }
    this->base_num_threads = nproc;
    this->resizing = '\0';
  }
  return;
}

Assistant:

void resize(kmp_uint32 nproc) {
    kmp_int8 bool_result = KMP_COMPARE_AND_STORE_ACQ8(&resizing, 0, 1);
    while (bool_result == 0) { // someone else is trying to resize
      KMP_CPU_PAUSE();
      if (nproc <= base_num_threads) // happy with other thread's resize
        return;
      else // try to resize
        bool_result = KMP_COMPARE_AND_STORE_ACQ8(&resizing, 0, 1);
    }
    KMP_DEBUG_ASSERT(bool_result != 0);
    if (nproc <= base_num_threads)
      return; // happy with other thread's resize

    // Calculate new maxLevels
    kmp_uint32 old_sz = skipPerLevel[depth - 1];
    kmp_uint32 incs = 0, old_maxLevels = maxLevels;
    // First see if old maxLevels is enough to contain new size
    for (kmp_uint32 i = depth; i < maxLevels && nproc > old_sz; ++i) {
      skipPerLevel[i] = 2 * skipPerLevel[i - 1];
      numPerLevel[i - 1] *= 2;
      old_sz *= 2;
      depth++;
    }
    if (nproc > old_sz) { // Not enough space, need to expand hierarchy
      while (nproc > old_sz) {
        old_sz *= 2;
        incs++;
        depth++;
      }
      maxLevels += incs;

      // Resize arrays
      kmp_uint32 *old_numPerLevel = numPerLevel;
      kmp_uint32 *old_skipPerLevel = skipPerLevel;
      numPerLevel = skipPerLevel = NULL;
      numPerLevel =
          (kmp_uint32 *)__kmp_allocate(maxLevels * 2 * sizeof(kmp_uint32));
      skipPerLevel = &(numPerLevel[maxLevels]);

      // Copy old elements from old arrays
      for (kmp_uint32 i = 0; i < old_maxLevels;
           ++i) { // init numPerLevel[*] to 1 item per level
        numPerLevel[i] = old_numPerLevel[i];
        skipPerLevel[i] = old_skipPerLevel[i];
      }

      // Init new elements in arrays to 1
      for (kmp_uint32 i = old_maxLevels; i < maxLevels;
           ++i) { // init numPerLevel[*] to 1 item per level
        numPerLevel[i] = 1;
        skipPerLevel[i] = 1;
      }

      // Free old arrays
      __kmp_free(old_numPerLevel);
    }

    // Fill in oversubscription levels of hierarchy
    for (kmp_uint32 i = old_maxLevels; i < maxLevels; ++i)
      skipPerLevel[i] = 2 * skipPerLevel[i - 1];

    base_num_threads = nproc;
    resizing = 0; // One writer
  }